

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<BasicContext>::disposeImpl(HeapDisposer<BasicContext> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    if (*(long *)((long)pointer + 0x180) == 0) {
      EventLoop::leaveScope(*(EventLoop **)((long)pointer + 0x170));
    }
    EventLoop::~EventLoop((EventLoop *)((long)pointer + 0xf8));
    UnixEventPort::~UnixEventPort((UnixEventPort *)pointer);
    operator_delete(pointer,400);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }